

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::Quest(Compiler *this,Frag a,bool nongreedy)

{
  bool bVar1;
  uint32_t begin;
  PatchList PVar2;
  byte in_DL;
  Frag in_RSI;
  Compiler *in_RDI;
  PatchList pl;
  int id;
  uint32_t in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  PatchList in_stack_ffffffffffffffcc;
  PatchList in_stack_ffffffffffffffd0;
  uint32_t local_2c;
  Frag in_stack_fffffffffffffff8;
  
  bVar1 = IsNoMatch(in_RSI);
  PVar2 = in_RSI.end.p;
  if (bVar1) {
    in_stack_fffffffffffffff8 = Nop(in_RDI);
  }
  else {
    begin = AllocInst((Compiler *)in_stack_fffffffffffffff8,PVar2.p);
    if ((int)begin < 0) {
      in_stack_fffffffffffffff8 =
           NoMatch((Compiler *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    else {
      if ((in_DL & 1) == 0) {
        PODArray<re2::Prog::Inst>::operator[]
                  ((PODArray<re2::Prog::Inst> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
        Prog::Inst::InitAlt((Inst *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        in_stack_ffffffffffffffcc = PatchList::Mk(begin << 1 | 1);
        local_2c = in_stack_ffffffffffffffcc.p;
      }
      else {
        PODArray<re2::Prog::Inst>::operator[]
                  ((PODArray<re2::Prog::Inst> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   in_stack_ffffffffffffffac);
        Prog::Inst::InitAlt((Inst *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        in_stack_ffffffffffffffd0 = PatchList::Mk(begin << 1);
        local_2c = in_stack_ffffffffffffffd0.p;
      }
      PODArray<re2::Prog::Inst>::data((PODArray<re2::Prog::Inst> *)0x21d03c);
      PVar2 = PatchList::Append((Inst *)CONCAT44(local_2c,PVar2.p),in_stack_ffffffffffffffd0,
                                in_stack_ffffffffffffffcc);
      Frag::Frag((Frag *)&stack0xfffffffffffffff8,begin,PVar2);
    }
  }
  return in_stack_fffffffffffffff8;
}

Assistant:

Frag Compiler::Quest(Frag a, bool nongreedy) {
  if (IsNoMatch(a))
    return Nop();
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  PatchList pl;
  if (nongreedy) {
    inst_[id].InitAlt(0, a.begin);
    pl = PatchList::Mk(id << 1);
  } else {
    inst_[id].InitAlt(a.begin, 0);
    pl = PatchList::Mk((id << 1) | 1);
  }
  return Frag(id, PatchList::Append(inst_.data(), pl, a.end));
}